

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O2

UnicodeString *
icu_63::SimpleFormatter::format
          (UChar *compiledPattern,int32_t compiledPatternLength,UnicodeString **values,
          UnicodeString *result,UnicodeString *resultCopy,UBool forbidResultAsValue,int32_t *offsets
          ,int32_t offsetsLength,UErrorCode *errorCode)

{
  UChar UVar1;
  short sVar2;
  UnicodeString *srcText;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  undefined3 in_register_00000089;
  int iVar7;
  ConstChar16Ptr local_60;
  undefined4 local_54;
  UnicodeString *local_50;
  UnicodeString **local_48;
  UChar *local_40;
  
  local_54 = CONCAT31(in_register_00000089,forbidResultAsValue);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar3 = 0;
    uVar6 = 0;
    if (0 < offsetsLength) {
      uVar6 = (ulong)(uint)offsetsLength;
    }
    for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      offsets[uVar3] = -1;
    }
    iVar7 = 1;
    local_50 = resultCopy;
    local_48 = values;
    while (iVar7 < compiledPatternLength) {
      lVar4 = (long)iVar7;
      iVar7 = iVar7 + 1;
      UVar1 = compiledPattern[lVar4];
      if ((ushort)UVar1 < 0x100) {
        srcText = local_48[(ushort)UVar1];
        if (srcText == (UnicodeString *)0x0) {
LAB_00296c1a:
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          return result;
        }
        if (srcText == result) {
          if ((char)local_54 != '\0') goto LAB_00296c1a;
          if (iVar7 == 2) {
            iVar7 = 2;
            if ((int)(uint)(ushort)UVar1 < offsetsLength) {
              offsets[(ushort)UVar1] = 0;
            }
          }
          else {
            if ((int)(uint)(ushort)UVar1 < offsetsLength) {
              sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
              if (sVar2 < 0) {
                iVar5 = (result->fUnion).fFields.fLength;
              }
              else {
                iVar5 = (int)sVar2 >> 5;
              }
              offsets[(ushort)UVar1] = iVar5;
            }
            UnicodeString::append(result,local_50);
          }
        }
        else {
          if ((int)(uint)(ushort)UVar1 < offsetsLength) {
            sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
            if (sVar2 < 0) {
              iVar5 = (result->fUnion).fFields.fLength;
            }
            else {
              iVar5 = (int)sVar2 >> 5;
            }
            offsets[(ushort)UVar1] = iVar5;
          }
          UnicodeString::append(result,srcText);
        }
      }
      else {
        iVar5 = (ushort)UVar1 - 0x100;
        local_60.p_ = compiledPattern + iVar7;
        UnicodeString::append(result,&local_60,iVar5);
        local_40 = local_60.p_;
        iVar7 = iVar7 + iVar5;
      }
    }
  }
  return result;
}

Assistant:

UnicodeString &SimpleFormatter::format(
        const UChar *compiledPattern, int32_t compiledPatternLength,
        const UnicodeString *const *values,
        UnicodeString &result, const UnicodeString *resultCopy, UBool forbidResultAsValue,
        int32_t *offsets, int32_t offsetsLength,
        UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return result;
    }
    for (int32_t i = 0; i < offsetsLength; i++) {
        offsets[i] = -1;
    }
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t n = compiledPattern[i++];
        if (n < ARG_NUM_LIMIT) {
            const UnicodeString *value = values[n];
            if (value == NULL) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                return result;
            }
            if (value == &result) {
                if (forbidResultAsValue) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return result;
                }
                if (i == 2) {
                    // We are appending to result which is also the first value object.
                    if (n < offsetsLength) {
                        offsets[n] = 0;
                    }
                } else {
                    if (n < offsetsLength) {
                        offsets[n] = result.length();
                    }
                    result.append(*resultCopy);
                }
            } else {
                if (n < offsetsLength) {
                    offsets[n] = result.length();
                }
                result.append(*value);
            }
        } else {
            int32_t length = n - ARG_NUM_LIMIT;
            result.append(compiledPattern + i, length);
            i += length;
        }
    }
    return result;
}